

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::CheckTypeCompatibility
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZMatrix<std::complex<double>_> *A,
          TPZMatrix<std::complex<double>_> *B)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  anon_class_1_0_00000001 incompatSparse;
  anon_class_1_0_00000001 local_11;
  
  if (A == (TPZMatrix<std::complex<double>_> *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(A,&TPZMatrix<std::complex<double>>::typeinfo,
                           &TPZFYsmpMatrix<std::complex<double>>::typeinfo);
  }
  if (B == (TPZMatrix<std::complex<double>_> *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(B,&TPZMatrix<std::complex<double>>::typeinfo,
                           &TPZFYsmpMatrix<std::complex<double>>::typeinfo,0);
    if (lVar2 != 0 && lVar3 != 0) goto LAB_00dcfb89;
  }
  CheckTypeCompatibility::anon_class_1_0_00000001::operator()(&local_11);
LAB_00dcfb89:
  lVar5 = 0;
  lVar4 = *(long *)(lVar2 + 0x30);
  if (*(long *)(lVar2 + 0x30) < 1) {
    lVar4 = lVar5;
  }
  bVar6 = false;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    bVar1 = !bVar6;
    bVar6 = true;
    if (bVar1) {
      bVar6 = *(long *)(*(long *)(lVar2 + 0x28) + lVar5 * 8) !=
              *(long *)(*(long *)(lVar3 + 0x28) + lVar5 * 8);
    }
  }
  lVar5 = 0;
  lVar4 = *(long *)(lVar2 + 0x50);
  if (*(long *)(lVar2 + 0x50) < 1) {
    lVar4 = lVar5;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    bVar1 = !bVar6;
    bVar6 = true;
    if (bVar1) {
      bVar6 = *(long *)(*(long *)(lVar2 + 0x48) + lVar5 * 8) !=
              *(long *)(*(long *)(lVar3 + 0x48) + lVar5 * 8);
    }
  }
  if (bVar6) {
    CheckTypeCompatibility::anon_class_1_0_00000001::operator()(&local_11);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::CheckTypeCompatibility(const TPZMatrix<TVar>*A,
																									const TPZMatrix<TVar>*B)const
{
  auto incompatSparse = [](){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: incompatible matrices\n.Aborting...\n";
    DebugStop();
  };
	auto aPtr = dynamic_cast<const TPZFYsmpMatrix<TVar>*>(A);
  auto bPtr = dynamic_cast<const TPZFYsmpMatrix<TVar>*>(B);
  if(!aPtr || !bPtr){
    incompatSparse();
  }
	bool check{false};
	const auto nIA = aPtr->fIA.size();
	for(auto i = 0; i < nIA; i++){
		check = check || aPtr->fIA[i] != bPtr->fIA[i];
	}

	const auto nJA = aPtr->fJA.size();
	for(auto i = 0; i < nJA; i++){
		check = check || aPtr->fJA[i] != bPtr->fJA[i];
	}
	if(check) incompatSparse();
}